

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

t_int * sigczero_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  t_int tVar6;
  t_sample coefim;
  t_sample coefre;
  t_sample nextim;
  t_sample nextre;
  t_sample lastim;
  t_sample lastre;
  int i;
  int n;
  t_sigczero *x;
  t_sample *outim;
  t_sample *outre;
  t_sample *inim2;
  t_sample *inre2;
  t_sample *inim1;
  t_sample *inre1;
  t_int *w_local;
  
  lVar5 = w[7];
  tVar6 = w[8];
  nextim = *(t_sample *)(lVar5 + 0x38);
  nextre = *(t_sample *)(lVar5 + 0x34);
  x = (t_sigczero *)w[6];
  outim = (t_sample *)w[5];
  outre = (t_sample *)w[4];
  inim2 = (t_sample *)w[3];
  inre2 = (t_sample *)w[2];
  inim1 = (t_sample *)w[1];
  for (lastim = 0.0; (int)lastim < (int)tVar6; lastim = (t_sample)((int)lastim + 1)) {
    fVar1 = *inim1;
    fVar2 = *inre2;
    fVar3 = *inim2;
    fVar4 = *outre;
    *outim = nextim * fVar4 + -nextre * fVar3 + fVar1;
    *(float *)&(x->x_obj).te_g.g_pd = -nextim * fVar3 + -nextre * fVar4 + fVar2;
    nextim = fVar2;
    nextre = fVar1;
    x = (t_sigczero *)((long)&(x->x_obj).te_g.g_pd + 4);
    outim = outim + 1;
    outre = outre + 1;
    inim2 = inim2 + 1;
    inre2 = inre2 + 1;
    inim1 = inim1 + 1;
  }
  *(t_sample *)(lVar5 + 0x34) = nextre;
  *(t_sample *)(lVar5 + 0x38) = nextim;
  return w + 9;
}

Assistant:

static t_int *sigczero_perform(t_int *w)
{
    t_sample *inre1 = (t_sample *)(w[1]);
    t_sample *inim1 = (t_sample *)(w[2]);
    t_sample *inre2 = (t_sample *)(w[3]);
    t_sample *inim2 = (t_sample *)(w[4]);
    t_sample *outre = (t_sample *)(w[5]);
    t_sample *outim = (t_sample *)(w[6]);
    t_sigczero *x = (t_sigczero *)(w[7]);
    int n = (int)w[8];
    int i;
    t_sample lastre = x->x_lastre;
    t_sample lastim = x->x_lastim;
    for (i = 0; i < n; i++)
    {
        t_sample nextre = *inre1++;
        t_sample nextim = *inim1++;
        t_sample coefre = *inre2++;
        t_sample coefim = *inim2++;
        *outre++ = nextre - lastre * coefre + lastim * coefim;
        *outim++ = nextim - lastre * coefim - lastim * coefre;
        lastre = nextre;
        lastim = nextim;
    }
    x->x_lastre = lastre;
    x->x_lastim = lastim;
    return (w+9);
}